

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall
tinyusdz::
TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
::add_sample(TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
             *this,double t,
            vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
            *v)

{
  Sample s;
  Sample local_38;
  
  local_38.value.
  super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_38.value.
  super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  local_38.blocked = false;
  local_38.value.
  super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.value.
  super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_38.value.
  super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_38.t = t;
  ::std::
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  ::operator=(&local_38.value,v);
  ::std::
  vector<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>::Sample>>
  ::
  emplace_back<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>::Sample>>
              *)this,&local_38);
  this->_dirty = true;
  if (local_38.value.
      super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.value.
                    super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    CONCAT71(local_38.value.
                             super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_38.value.
                             super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                    (long)local_38.value.
                          super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }